

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O3

QPointF roundInDeviceCoordinates(QPointF *p,QTransform *m)

{
  ulong uVar1;
  double dVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  QPointF QVar6;
  QPointF local_88;
  QTransform local_70;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QTransform::inverted(&local_70,m,(bool *)0x0);
  QVar6 = QTransform::map(m,p);
  auVar3._0_8_ = (double)((ulong)QVar6.xp & 0x8000000000000000 | 0x3fe0000000000000) + QVar6.xp;
  auVar3._8_8_ = (double)((ulong)QVar6.yp & 0x8000000000000000 | 0x3fe0000000000000) + QVar6.yp;
  auVar4 = maxpd(auVar3,_DAT_006747a0);
  uVar1 = -(ulong)(2147483647.0 < auVar3._8_8_) & 0x41dfffffffc00000;
  auVar5._0_8_ = ~-(ulong)(2147483647.0 < auVar3._0_8_) & auVar4._0_8_;
  auVar5._8_8_ = ~-(ulong)(2147483647.0 < auVar3._8_8_) & auVar4._8_8_;
  auVar4._8_4_ = (int)uVar1;
  auVar4._0_8_ = -(ulong)(2147483647.0 < auVar3._0_8_) & 0x41dfffffffc00000;
  auVar4._12_4_ = (int)(uVar1 >> 0x20);
  dVar2 = (double)(int)SUB168(auVar5 | auVar4,8);
  local_88.yp._0_4_ = SUB84(dVar2,0);
  local_88.xp = (double)(int)SUB168(auVar5 | auVar4,0);
  local_88.yp._4_4_ = (int)((ulong)dVar2 >> 0x20);
  QVar6 = QTransform::map(&local_70,&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

static inline QPointF roundInDeviceCoordinates(const QPointF &p, const QTransform &m)
{
    return m.inverted().map(QPointF(m.map(p).toPoint()));
}